

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O2

wchar_t rar5_bid(archive_read *a,wchar_t best_bid)

{
  wchar_t wVar1;
  int *piVar2;
  void *pvVar3;
  wchar_t wVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  long local_38;
  uint8_t *p;
  
  wVar4 = L'\xffffffff';
  if (best_bid < L'\x1f') {
    rar5_signature((char *)&local_38);
    wVar1 = read_ahead(a,8,&p);
    if ((wVar1 == L'\0') || (local_38 != *(long *)p)) {
      piVar2 = (int *)__archive_read_ahead(a,7,(ssize_t *)0x0);
      if ((piVar2 != (int *)0x0) &&
         ((((char)*piVar2 == 'M' && (*(char *)((long)piVar2 + 1) == 'Z')) ||
          (wVar4 = L'\0', *piVar2 == 0x464c457f)))) {
        rar5_signature((char *)&p);
        lVar5 = 0x10000;
        uVar6 = 0x1000;
        do {
          while( true ) {
            if (0x80000 < (long)(uVar6 + lVar5)) goto LAB_0014097d;
            pvVar3 = __archive_read_ahead(a,uVar6 + lVar5,&local_38);
            if (pvVar3 == (void *)0x0) break;
            for (; (ulong)((long)pvVar3 + lVar5 + 8) < (ulong)(local_38 + (long)pvVar3);
                lVar5 = lVar5 + 0x10) {
              if (*(uint8_t **)((long)pvVar3 + lVar5) == p) {
                return L'\x1e';
              }
            }
          }
          bVar7 = 0x7f < uVar6;
          uVar6 = uVar6 >> 1;
        } while (bVar7);
LAB_0014097d:
        wVar4 = L'\0';
      }
    }
    else {
      wVar4 = L'\x1e';
    }
  }
  return wVar4;
}

Assistant:

static int rar5_bid(struct archive_read* a, int best_bid) {
	int my_bid;

	if(best_bid > 30)
		return -1;

	my_bid = bid_standard(a);
	if(my_bid > -1) {
		return my_bid;
	}
	my_bid = bid_sfx(a);
	if (my_bid > -1) {
		return my_bid;
	}

	return -1;
}